

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,BytesMode bytes_mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  once_flag *poVar2;
  bool bVar3;
  Descriptor *descriptor;
  string *psVar4;
  EnumDescriptor *enum_descriptor;
  string *extraout_RAX;
  char *pcVar5;
  char *pcVar6;
  GeneratorOptions *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  poVar2 = (once_flag *)(options->namespace_prefix).field_2._M_allocated_capacity;
  if (poVar2 != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = options;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (poVar2,&local_28,(FieldDescriptor **)&local_30);
  }
  psVar4 = (string *)(ulong)*(uint *)((long)&(options->namespace_prefix).field_2 + 8);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (long)psVar4 * 4)) {
  case 1:
  case 2:
  case 3:
  case 4:
    bVar3 = anon_unknown_0::IsIntegralFieldWithStringJSType((FieldDescriptor *)options);
    pcVar6 = "number";
    if (bVar3) {
      pcVar6 = "string";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "";
    if (bVar3) {
      pcVar5 = "";
    }
    break;
  case 5:
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "number";
    pcVar5 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "boolean";
    pcVar5 = "";
    break;
  case 8:
    enum_descriptor = FieldDescriptor::enum_type((FieldDescriptor *)options);
    psVar4 = GetEnumPath_abi_cxx11_
                       (__return_storage_ptr__,*(_anonymous_namespace_ **)(this + 0x20),
                        *(GeneratorOptions **)(this + 0x28),enum_descriptor);
    return psVar4;
  case 9:
    poVar2 = (once_flag *)(options->namespace_prefix).field_2._M_allocated_capacity;
    if (poVar2 != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = options;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (poVar2,&local_28,(FieldDescriptor **)&local_30);
      psVar4 = (string *)(ulong)*(uint *)((long)&(options->namespace_prefix).field_2 + 8);
    }
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    if ((int)psVar4 == 0xc) {
      if ((int)field == 2) {
        paVar1->_M_allocated_capacity = 0x72724138746e6955;
        *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 8) = 0x7961;
        __return_storage_ptr__->_M_string_length = 10;
        (__return_storage_ptr__->field_2)._M_local_buf[10] = '\0';
        return (string *)0x72724138746e6955;
      }
      if ((int)field != 1) {
        pcVar6 = "(string|Uint8Array)";
        pcVar5 = "";
        break;
      }
    }
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 4) = 0x676e;
    *(undefined4 *)paVar1 = 0x69727473;
    __return_storage_ptr__->_M_string_length = 6;
    (__return_storage_ptr__->field_2)._M_local_buf[6] = '\0';
    return psVar4;
  case 10:
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)options);
    psVar4 = GetMessagePath_abi_cxx11_
                       (__return_storage_ptr__,*(_anonymous_namespace_ **)(this + 0x20),
                        *(GeneratorOptions **)(this + 0x28),descriptor);
    return psVar4;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "";
    pcVar6 = pcVar5;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return extraout_RAX;
}

Assistant:

std::string JSTypeName(const GeneratorOptions& options,
                       const FieldDescriptor* field, BytesMode bytes_mode) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return "boolean";
    case FieldDescriptor::CPPTYPE_INT32:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_INT64:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_UINT32:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_UINT64:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "number";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "number";
    case FieldDescriptor::CPPTYPE_STRING:
      return JSStringTypeName(options, field, bytes_mode);
    case FieldDescriptor::CPPTYPE_ENUM:
      return GetEnumPath(options, field->enum_type());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return GetMessagePath(options, field->message_type());
    default:
      return "";
  }
}